

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::BasicTexSubImageCubeCase::createTexture(BasicTexSubImageCubeCase *this)

{
  ContextWrapper *this_00;
  deUint32 dVar1;
  deUint32 dVar2;
  uint uVar3;
  deUint32 dVar4;
  int width;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int local_104;
  deUint32 tex;
  ulong local_e8;
  int local_e0;
  int local_dc;
  BasicTexSubImageCubeCase *local_d8;
  ContextWrapper *local_d0;
  TextureFormat fmt;
  Random rnd;
  TextureLevel data;
  Vec4 gMax;
  Vec4 gMin;
  Vector<float,_4> local_68;
  PixelBufferAccess local_58;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  if (((this->super_TextureSpecCase).m_flags & 1) == 0) {
    local_104 = 1;
  }
  else {
    uVar5 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar7 = uVar3;
    if (uVar5 != 0) {
      uVar7 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = uVar7 ^ 0x1f;
    }
    uVar5 = (this->super_TextureSpecCase).m_height;
    if (uVar5 != 0) {
      uVar3 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    local_104 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar7)) {
      local_104 = 0x1f - uVar7;
    }
    local_104 = local_104 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_d8 = this;
  local_d0 = this_00;
  for (iVar6 = 0; iVar6 != local_104; iVar6 = iVar6 + 1) {
    iVar10 = (this->super_TextureSpecCase).m_width >> ((byte)iVar6 & 0x1f);
    if (iVar10 < 2) {
      iVar10 = 1;
    }
    iVar8 = (this->super_TextureSpecCase).m_height >> ((byte)iVar6 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    local_e8 = CONCAT44(local_e8._4_4_,iVar10);
    tcu::TextureLevel::setSize(&data,iVar10,iVar8,1);
    for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
      randomVector<4>((Functional *)&gMin,&rnd,(Vector<float,_4> *)&local_58,
                      (Vector<float,_4> *)&gMax);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector(&local_68,1.0);
      randomVector<4>((Functional *)&gMax,&rnd,(Vector<float,_4> *)&local_58,&local_68);
      tcu::TextureLevel::getAccess(&local_58,&data);
      tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
      dVar4 = *(deUint32 *)((long)&s_cubeMapFaces + lVar9);
      dVar1 = this->m_format;
      dVar2 = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&data);
      sglr::ContextWrapper::glTexImage2D
                (local_d0,dVar4,iVar6,dVar1,(int)local_e8,iVar8,0,dVar1,dVar2,
                 local_58.super_ConstPixelBufferAccess.m_data);
      this = local_d8;
    }
  }
  for (iVar6 = 0; iVar6 != local_104; iVar6 = iVar6 + 1) {
    iVar10 = (this->super_TextureSpecCase).m_width >> ((byte)iVar6 & 0x1f);
    if (iVar10 < 2) {
      iVar10 = 1;
    }
    iVar8 = (this->super_TextureSpecCase).m_height >> ((byte)iVar6 & 0x1f);
    if (iVar8 < 2) {
      iVar8 = 1;
    }
    for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 4) {
      width = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar10);
      uVar5 = de::Random::getInt((Random *)&rnd.m_rnd,1,iVar8);
      local_dc = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar10 - width);
      local_e0 = de::Random::getInt((Random *)&rnd.m_rnd,0,iVar8 - uVar5);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&gMax,1.0);
      randomVector<4>((Functional *)&gMin,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_58,
                      (Vector<float,_4> *)&gMax);
      local_e8 = (ulong)uVar5;
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_58,0.0);
      tcu::Vector<float,_4>::Vector(&local_68,1.0);
      randomVector<4>((Functional *)&gMax,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_58,
                      &local_68);
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      tcu::TextureLevel::setSize(&data,width,(int)local_e8,1);
      tcu::TextureLevel::getAccess(&local_58,&data);
      tcu::fillWithGrid(&local_58,dVar4 % 0xf + 2,&gMin,&gMax);
      dVar4 = *(deUint32 *)((long)&s_cubeMapFaces + lVar9);
      dVar1 = this->m_format;
      dVar2 = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_58,&data);
      sglr::ContextWrapper::glTexSubImage2D
                (local_d0,dVar4,iVar6,local_dc,local_e0,width,(int)local_e8,dVar1,dVar2,
                 local_58.super_ConstPixelBufferAccess.m_data);
      this = local_d8;
    }
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			data.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}

		// Re-specify parts of each face and level.
		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				int		w			= rnd.getInt(1, levelW);
				int		h			= rnd.getInt(1, levelH);
				int		x			= rnd.getInt(0, levelW-w);
				int		y			= rnd.getInt(0, levelH-h);

				Vec4	colorA		= randomVector<4>(rnd);
				Vec4	colorB		= randomVector<4>(rnd);
				int		cellSize	= rnd.getInt(2, 16);

				data.setSize(w, h);
				tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

				glTexSubImage2D(s_cubeMapFaces[face], ndx, x, y, w, h, m_format, m_dataType, data.getAccess().getDataPtr());
			}
		}
	}